

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewRandomAccessFile
          (PosixEnv *this,string *filename,RandomAccessFile **result)

{
  RandomAccessFile **ppRVar1;
  bool bVar2;
  char *__file;
  int *piVar3;
  PosixRandomAccessFile *this_00;
  PosixMmapReadableFile *this_01;
  undefined8 *in_RCX;
  Status local_a8;
  undefined1 local_99;
  string local_98 [32];
  char *local_78;
  void *mmap_base;
  size_t local_68;
  uint64_t file_size;
  string local_50 [36];
  int local_2c;
  undefined8 *puStack_28;
  int fd;
  RandomAccessFile **result_local;
  string *filename_local;
  PosixEnv *this_local;
  Status *status;
  
  *in_RCX = 0;
  puStack_28 = in_RCX;
  result_local = result;
  filename_local = filename;
  this_local = this;
  __file = (char *)std::__cxx11::string::c_str();
  local_2c = open(__file,0x80000);
  ppRVar1 = result_local;
  if (local_2c < 0) {
    piVar3 = __errno_location();
    PosixError((anon_unknown_1 *)this,(string *)ppRVar1,*piVar3);
  }
  else {
    bVar2 = Limiter::Acquire((Limiter *)(filename + 0x118));
    if (bVar2) {
      mmap_base._7_1_ = 0;
      (**(code **)(*(long *)filename + 0x58))(this,filename,result_local,&local_68);
      bVar2 = Status::ok((Status *)this);
      if (bVar2) {
        local_78 = (char *)mmap((void *)0x0,local_68,1,1,local_2c,0);
        ppRVar1 = result_local;
        if (local_78 == (char *)0xffffffffffffffff) {
          piVar3 = __errno_location();
          PosixError((anon_unknown_1 *)&local_a8,(string *)ppRVar1,*piVar3);
          Status::operator=((Status *)this,&local_a8);
          Status::~Status(&local_a8);
        }
        else {
          this_01 = (PosixMmapReadableFile *)operator_new(0x40);
          local_99 = 1;
          std::__cxx11::string::string(local_98,(string *)result_local);
          PosixMmapReadableFile::PosixMmapReadableFile
                    (this_01,(string *)local_98,local_78,local_68,(Limiter *)(filename + 0x118));
          local_99 = 0;
          *puStack_28 = this_01;
          std::__cxx11::string::~string(local_98);
        }
      }
      close(local_2c);
      bVar2 = Status::ok((Status *)this);
      if (!bVar2) {
        Limiter::Release((Limiter *)(filename + 0x118));
      }
    }
    else {
      this_00 = (PosixRandomAccessFile *)operator_new(0x38);
      file_size._3_1_ = 1;
      std::__cxx11::string::string(local_50,(string *)result_local);
      PosixRandomAccessFile::PosixRandomAccessFile
                (this_00,(string *)local_50,local_2c,(Limiter *)(filename + 0x11c));
      file_size._3_1_ = 0;
      *puStack_28 = this_00;
      std::__cxx11::string::~string(local_50);
      Status::OK();
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status NewRandomAccessFile(const std::string& filename,
                             RandomAccessFile** result) override {
    *result = nullptr;
    int fd = ::open(filename.c_str(), O_RDONLY | kOpenBaseFlags);
    if (fd < 0) {
      return PosixError(filename, errno);
    }

    if (!mmap_limiter_.Acquire()) {
      *result = new PosixRandomAccessFile(filename, fd, &fd_limiter_);
      return Status::OK();
    }

    uint64_t file_size;
    Status status = GetFileSize(filename, &file_size);
    if (status.ok()) {
      void* mmap_base =
          ::mmap(/*addr=*/nullptr, file_size, PROT_READ, MAP_SHARED, fd, 0);
      if (mmap_base != MAP_FAILED) {
        *result = new PosixMmapReadableFile(filename,
                                            reinterpret_cast<char*>(mmap_base),
                                            file_size, &mmap_limiter_);
      } else {
        status = PosixError(filename, errno);
      }
    }
    ::close(fd);
    if (!status.ok()) {
      mmap_limiter_.Release();
    }
    return status;
  }